

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

void If_DsdObjSort(If_DsdMan_t *pMan,Vec_Ptr_t *p,int *pLits,int nLits,int *pPerm)

{
  int iVar1;
  int t_1;
  int t;
  int best_i;
  int j;
  int i;
  int *pPerm_local;
  int nLits_local;
  int *pLits_local;
  Vec_Ptr_t *p_local;
  If_DsdMan_t *pMan_local;
  
  for (best_i = 0; best_i < nLits + -1; best_i = best_i + 1) {
    t_1 = best_i;
    t = best_i;
    while (t = t + 1, t < nLits) {
      iVar1 = If_DsdObjCompare(pMan,p,pLits[t_1],pLits[t]);
      if (iVar1 == 1) {
        t_1 = t;
      }
    }
    if (best_i != t_1) {
      iVar1 = pLits[best_i];
      pLits[best_i] = pLits[t_1];
      pLits[t_1] = iVar1;
      if (pPerm != (int *)0x0) {
        iVar1 = pPerm[best_i];
        pPerm[best_i] = pPerm[t_1];
        pPerm[t_1] = iVar1;
      }
    }
  }
  return;
}

Assistant:

void If_DsdObjSort( If_DsdMan_t * pMan, Vec_Ptr_t * p, int * pLits, int nLits, int * pPerm )
{
    int i, j, best_i;
    for ( i = 0; i < nLits-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < nLits; j++ )
            if ( If_DsdObjCompare(pMan, p, pLits[best_i], pLits[j]) == 1 )
                best_i = j;
        if ( i == best_i )
            continue;
        ABC_SWAP( int, pLits[i], pLits[best_i] );
        if ( pPerm )
            ABC_SWAP( int, pPerm[i], pPerm[best_i] );
    }
}